

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::AckMessageTest_TestEqualsSimilar_Test::TestBody
          (AckMessageTest_TestEqualsSimilar_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_b0;
  Message local_a8;
  hash<bidfx_public_api::price::pixie::AckMessage> local_99;
  size_t local_98;
  hash<bidfx_public_api::price::pixie::AckMessage> local_89;
  size_t local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  AckMessage newMessage;
  AckMessageTest_TestEqualsSimilar_Test *this_local;
  
  bidfx_public_api::price::pixie::AckMessage::AckMessage
            ((AckMessage *)&gtest_ar.message_,0x12d687,0x1497bc5cce8,0x1497bc5cdb0,0x1497bc5cdb1,
             0x29a);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::pixie::AckMessage,bidfx_public_api::price::pixie::AckMessage>
            ((EqHelper<false> *)local_50,"ackMessage","newMessage",(AckMessage *)ackMessage,
             (AckMessage *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_88 = std::hash<bidfx_public_api::price::pixie::AckMessage>::operator()
                       (&local_89,(AckMessage *)ackMessage);
  local_98 = std::hash<bidfx_public_api::price::pixie::AckMessage>::operator()
                       (&local_99,(AckMessage *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_80,"std::hash<AckMessage>()(ackMessage)",
             "std::hash<AckMessage>()(newMessage)",&local_88,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  return;
}

Assistant:

TEST(AckMessageTest, TestEqualsSimilar)
{
    AckMessage newMessage = AckMessage(1234567, 1415120801000L, 1415120801200L, 1415120801201L, 666L);
    EXPECT_EQ(ackMessage, newMessage);
    EXPECT_EQ(std::hash<AckMessage>()(ackMessage), std::hash<AckMessage>()(newMessage));
}